

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

bool __thiscall ON_ClippingPlane::Read(ON_ClippingPlane *this,ON_BinaryArchive *file)

{
  ON_UUID uuid;
  bool bVar1;
  bool bVar2;
  ON_ClippingPlaneData *pOVar3;
  int i;
  int iVar4;
  ON__INT32 *p;
  double *pdVar5;
  double depth;
  uchar itemid;
  int minor_version;
  int count;
  double d;
  uchar auStack_60 [8];
  int major_version;
  ON_SimpleArray<int> *local_48;
  ON_UUID viewport_id;
  
  Default(this);
  major_version = 0;
  minor_version = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,&major_version,&minor_version);
  if (!bVar1) {
    return false;
  }
  if ((major_version == 1) && (bVar1 = ON_BinaryArchive::ReadUuid(file,&viewport_id), bVar1)) {
    if (minor_version == 0) {
      ON_UuidList::AddUuid(&this->m_viewport_ids,viewport_id,true);
    }
    bVar1 = ON_BinaryArchive::ReadUuid(file,&this->m_plane_id);
    if (((bVar1) && (bVar1 = ON_BinaryArchive::ReadPlane(file,&this->m_plane), bVar1)) &&
       (bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_bEnabled), bVar1)) {
      bVar1 = true;
      if (minor_version < 1) goto LAB_0057b863;
      bVar2 = ON_UuidList::Read(&this->m_viewport_ids,file);
      if (bVar2) {
        if (minor_version < 2) goto LAB_0057b863;
        d._0_4_ = 0;
        d._4_4_ = 0xbff00000;
        bVar2 = ON_BinaryArchive::ReadDouble(file,&d);
        if (bVar2) {
          depth = (double)CONCAT44(d._4_4_,d._0_4_);
          if (minor_version < 4) {
            if ((depth < 0.0) || ((depth == 1.2343210235867887e+38 && (!NAN(depth))))) {
              this->m_depth_enabled = false;
              d._0_4_ = 0;
              d._4_4_ = 0;
              depth = 0.0;
            }
            else {
              this->m_depth_enabled = true;
            }
          }
          SetDepth(this,depth);
          if (minor_version < 4) goto LAB_0057b863;
          bVar2 = ON_BinaryArchive::ReadBool(file,&this->m_depth_enabled);
          if (bVar2) {
            if (minor_version < 5) goto LAB_0057b863;
            itemid = 0xff;
            bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
            if (bVar1) {
              bVar2 = true;
              bVar1 = bVar2;
              if (itemid == '\0') goto LAB_0057b863;
              if (itemid == '\n') {
                p = &count;
                count = 0;
                bVar1 = ON_BinaryArchive::ReadInt(file,p);
                if (!bVar1) goto LAB_0057b860;
                pOVar3 = GetClippingPlaneData(&this->m_data_store,SUB81(p,0));
                d._0_4_ = 0;
                d._4_4_ = 0;
                auStack_60[0] = '\0';
                auStack_60[1] = '\0';
                auStack_60[2] = '\0';
                auStack_60[3] = '\0';
                auStack_60[4] = '\0';
                auStack_60[5] = '\0';
                auStack_60[6] = '\0';
                auStack_60[7] = '\0';
                for (iVar4 = 0; iVar4 < count; iVar4 = iVar4 + 1) {
                  bVar1 = ON_BinaryArchive::Read3dmReferencedComponentId
                                    (file,ModelGeometry,(ON_UUID *)&d);
                  if (!bVar1) goto LAB_0057b860;
                  if (pOVar3 != (ON_ClippingPlaneData *)0x0) {
                    uuid.Data2 = d._4_2_;
                    uuid.Data3 = d._6_2_;
                    uuid.Data1 = d._0_4_;
                    uuid.Data4[0] = auStack_60[0];
                    uuid.Data4[1] = auStack_60[1];
                    uuid.Data4[2] = auStack_60[2];
                    uuid.Data4[3] = auStack_60[3];
                    uuid.Data4[4] = auStack_60[4];
                    uuid.Data4[5] = auStack_60[5];
                    uuid.Data4[6] = auStack_60[6];
                    uuid.Data4[7] = auStack_60[7];
                    ON_UuidList::AddUuid(&pOVar3->m_object_id_list,uuid,true);
                  }
                }
                bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
                if (itemid == '\0' || !bVar1) goto LAB_0057b863;
              }
              if (itemid == '\v') {
                pdVar5 = &d;
                d._0_4_ = 0;
                bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)pdVar5);
                if (!bVar1) goto LAB_0057b860;
                pOVar3 = GetClippingPlaneData(&this->m_data_store,SUB81(pdVar5,0));
                local_48 = &pOVar3->m_layer_list;
                for (iVar4 = 0; iVar4 < d._0_4_; iVar4 = iVar4 + 1) {
                  count = 0;
                  bVar1 = ON_BinaryArchive::Read3dmReferencedComponentIndex(file,Layer,&count);
                  if (!bVar1) goto LAB_0057b860;
                  if (pOVar3 != (ON_ClippingPlaneData *)0x0) {
                    ON_SimpleArray<int>::Append(local_48,&count);
                    pOVar3->m_layer_list_is_sorted = false;
                  }
                }
                bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
                if (itemid == '\0' || !bVar1) goto LAB_0057b863;
              }
              if (itemid == '\f') {
                pdVar5 = &d;
                d._0_4_ = CONCAT31(d._1_3_,1);
                bVar1 = ON_BinaryArchive::ReadBool(file,(bool *)pdVar5);
                if (!bVar1) goto LAB_0057b860;
                pOVar3 = GetClippingPlaneData(&this->m_data_store,SUB81(pdVar5,0));
                if (pOVar3 != (ON_ClippingPlaneData *)0x0) {
                  pOVar3->m_is_exclusion_list = d._0_1_;
                }
                bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
                if (itemid == '\0' || !bVar1) goto LAB_0057b863;
              }
              if (itemid == '\r') {
                bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_participation_lists_enabled);
                if (!bVar1) goto LAB_0057b860;
                bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
                if (itemid == '\0' || !bVar1) goto LAB_0057b863;
              }
              bVar1 = bVar2;
              if (0xd < itemid) {
                itemid = '\0';
              }
              goto LAB_0057b863;
            }
          }
        }
      }
    }
  }
LAB_0057b860:
  bVar1 = false;
LAB_0057b863:
  bVar2 = ON_BinaryArchive::EndRead3dmChunk(file);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_ClippingPlane::Read( ON_BinaryArchive& file )
{
  Default();

  int major_version = 0;
  int minor_version = 0;
  
  bool rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;

  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    ON_UUID viewport_id;
    rc = file.ReadUuid(viewport_id);
    if(!rc) break;

    if( 0 == minor_version )
      m_viewport_ids.AddUuid( viewport_id );

    rc = file.ReadUuid(m_plane_id);
    if (!rc) break;

    rc = file.ReadPlane(m_plane);
    if (!rc) break;

    rc = file.ReadBool(&m_bEnabled);
    if (!rc) break;

    if( minor_version > 0 )
    {
      rc = m_viewport_ids.Read(file);
      if (!rc) break;
    }

    if (minor_version > 1)
    {
      double d = -1;
      rc = file.ReadDouble(&d);
      if (!rc) break;

      if (minor_version < 4)
      {
        if (d >= 0.0 && d != ON_UNSET_POSITIVE_FLOAT)
        {
          m_depth_enabled = true;
        }
        else
        {
          m_depth_enabled = false;
          d = 0.0;
        }
      }

      SetDepth(d);
    }

    if (minor_version >= 4)
    {
      rc = file.ReadBool(&m_depth_enabled);
      if (!rc) break;
    }

    if (minor_version >= 5)
    {
      unsigned char itemid = 0xFF;
      rc = file.ReadChar(&itemid);
      if (!rc) break;
      if (0 == itemid)
        break;

      if (ON_ClippingPlaneTypeCodes::ClipParticipationObjectList == itemid) // 10
      {
        int count = 0;
        rc = file.ReadInt(&count);
        if (!rc) break;

        ON_ClippingPlaneData* data = GetClippingPlaneData(m_data_store, true);
        ON_UUID object_id = ON_nil_uuid;
        for (int i = 0; i < count; i++)
        {
          rc = file.Read3dmReferencedComponentId(ON_ModelComponent::Type::ModelGeometry, &object_id);
          if (!rc) break;
          if (data)
            data->m_object_id_list.AddUuid(object_id);
        }
        if (!rc) break;

        rc = file.ReadChar(&itemid);
        if (!rc || 0 == itemid) break;
      }
      if (ON_ClippingPlaneTypeCodes::ClipParticipationLayerList == itemid) // 11
      {
        int count = 0;
        rc = file.ReadInt(&count);
        if (!rc) break;

        ON_ClippingPlaneData* data = GetClippingPlaneData(m_data_store, true);
        for (int i = 0; i < count; i++)
        {
          int layer_index = 0;
          rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::Layer, &layer_index);
          if (!rc) break;

          if (data)
          {
            data->m_layer_list.Append(layer_index);
            data->m_layer_list_is_sorted = false;
          }
        }
        if (!rc) break;

        rc = file.ReadChar(&itemid);
        if (!rc || 0 == itemid) break;
      }
      if (ON_ClippingPlaneTypeCodes::ClipParticipationIsExclusion == itemid) // 12
      {
        bool exclusion = true;
        rc = file.ReadBool(&exclusion);
        if (!rc) break;
        ON_ClippingPlaneData* data = GetClippingPlaneData(m_data_store, true);
        if (data)
          data->m_is_exclusion_list = exclusion;
        rc = file.ReadChar(&itemid);
        if (!rc || 0 == itemid) break;
      }
      if (ON_ClippingPlaneTypeCodes::ClipParticipationEnabled == itemid) // 13
      {
        rc = file.ReadBool(&m_participation_lists_enabled);
        if (!rc) break;
        rc = file.ReadChar(&itemid);
        if (!rc || 0 == itemid) break;
      }

      if (itemid >= ON_ClippingPlaneTypeCodes::NextTypeCode)
      {
        // we are reading file written with code newer
        // than this code (minor_version > 5)
        itemid = 0;
      }

      break;
    }

    break;
  }

  if ( !file.EndRead3dmChunk() )
    rc = false;

  return rc;
}